

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeReadIOCallback.cpp
# Opt level: O0

void __thiscall libebml::SafeReadIOCallback::Skip(SafeReadIOCallback *this,size_t Count)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  EndOfStreamX *this_00;
  long lVar2;
  int64 ActualPosition;
  int64 ExpectedPosition;
  int64 PrevPosition;
  size_t Count_local;
  SafeReadIOCallback *this_local;
  
  iVar1 = (*this->mIO->_vptr_IOCallback[5])();
  lVar2 = CONCAT44(extraout_var,iVar1) + Count;
  (*this->mIO->_vptr_IOCallback[3])(this->mIO,Count,1);
  iVar1 = (*this->mIO->_vptr_IOCallback[5])();
  if (CONCAT44(extraout_var_00,iVar1) != lVar2) {
    this_00 = (EndOfStreamX *)__cxa_allocate_exception(8);
    EndOfStreamX::EndOfStreamX(this_00,lVar2 - CONCAT44(extraout_var_00,iVar1));
    __cxa_throw(this_00,&EndOfStreamX::typeinfo,0);
  }
  return;
}

Assistant:

void
SafeReadIOCallback::Skip(size_t Count) {
  int64 PrevPosition     = mIO->getFilePointer();
  int64 ExpectedPosition = PrevPosition + Count;
  mIO->setFilePointer(Count, seek_current);
  int64 ActualPosition   = mIO->getFilePointer();

  if (ActualPosition != ExpectedPosition)
    throw SafeReadIOCallback::EndOfStreamX(ExpectedPosition - ActualPosition);
}